

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

CMutableTransaction * __thiscall
TestChain100Setup::CreateValidMempoolTransaction
          (CMutableTransaction *__return_storage_ptr__,TestChain100Setup *this,
          CTransactionRef input_transaction,uint32_t input_vout,int input_height,
          CKey input_signing_key,CScript output_destination,CAmount output_amount,bool submit)

{
  long lVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  CScript scriptPubKeyIn;
  undefined4 in_register_0000008c;
  long in_FS_OFFSET;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<CKey> __l_01;
  initializer_list<CTxOut> __l_02;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe74 [20];
  allocator_type local_169;
  vector<CKey,_std::allocator<CKey>_> local_168;
  allocator_type local_149;
  _Vector_base<COutPoint,_std::allocator<COutPoint>_> local_148;
  allocator_type local_129;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_128;
  CTxOut local_110;
  CKey local_e8;
  COutPoint local_d8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_b0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_a0;
  CTxOut output;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (element_type *)
           ((input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar6 = *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_a0,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)input_signing_key._0_8_);
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.capacity = input_vout;
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffe68;
  scriptPubKeyIn.super_CScriptBase._12_20_ = in_stack_fffffffffffffe74;
  CTxOut::CTxOut(&output,(CAmount *)&input_signing_key.keydata,scriptPubKeyIn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_a0);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&local_128,__l,&local_129);
  __l_00._M_len = 1;
  __l_00._M_array = &local_d8;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar3;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar4;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar5;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar6;
  local_d8.n = (uint32_t)
               input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&local_148,__l_00,&local_149);
  CKey::CKey(&local_e8,(CKey *)CONCAT44(in_register_0000008c,input_height));
  __l_01._M_len = 1;
  __l_01._M_array = &local_e8;
  std::vector<CKey,_std::allocator<CKey>_>::vector(&local_168,__l_01,&local_169);
  CTxOut::CTxOut(&local_110,&output);
  __l_02._M_len = 1;
  __l_02._M_array = &local_110;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78,__l_02,
             (allocator_type *)&stack0xfffffffffffffe77);
  CreateValidMempoolTransaction
            (__return_storage_ptr__,this,&local_128,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&local_148,input_vout,&local_168,
             (vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78,
             (bool)output_destination.super_CScriptBase._union.direct[0]);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&local_110.scriptPubKey.super_CScriptBase);
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&local_168);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_e8.keydata);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base(&local_148);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&output.scriptPubKey.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(CTransactionRef input_transaction,
                                                                     uint32_t input_vout,
                                                                     int input_height,
                                                                     CKey input_signing_key,
                                                                     CScript output_destination,
                                                                     CAmount output_amount,
                                                                     bool submit)
{
    COutPoint input{input_transaction->GetHash(), input_vout};
    CTxOut output{output_amount, output_destination};
    return CreateValidMempoolTransaction(/*input_transactions=*/{input_transaction},
                                         /*inputs=*/{input},
                                         /*input_height=*/input_height,
                                         /*input_signing_keys=*/{input_signing_key},
                                         /*outputs=*/{output},
                                         /*submit=*/submit);
}